

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::search_initialize(vw *all,search *sch)

{
  _Ios_Openmode _Var1;
  stringstream *psVar2;
  string *psVar3;
  long *in_RSI;
  undefined8 in_RDI;
  scored_action sa;
  search_private *priv;
  v_hashmap<unsigned_char_*,_Search::scored_action> *in_stack_ffffffffffffff50;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  scored_action local_2c [2];
  undefined8 *local_18;
  long *local_10;
  
  local_18 = (undefined8 *)*in_RSI;
  *local_18 = in_RDI;
  *(undefined1 *)((long)local_18 + 0x611) = 0;
  local_18[0x12] = mc_label_is_test;
  local_18[0xc] = 1;
  *(undefined4 *)((long)local_18 + 0x6c) = 0;
  *(undefined4 *)(local_18 + 0xf) = 0xfffffffe;
  local_10 = in_RSI;
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2);
  local_18[0x4f] = psVar2;
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2);
  local_18[0x50] = psVar2;
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2);
  local_18[0x51] = psVar2;
  std::ios::clear((int)(long *)local_18[0x51] +
                  (int)*(undefined8 *)(*(long *)local_18[0x51] + -0x18));
  *(undefined4 *)(local_18 + 0x53) = 3;
  *(undefined4 *)((long)local_18 + 0x29c) = 3;
  *(undefined1 *)((long)local_18 + 0x2a5) = 1;
  *(undefined1 *)((long)local_18 + 0x2a6) = 1;
  *(undefined4 *)(local_18 + 0x58) = 1;
  local_18[7] = 1;
  *(undefined4 *)(local_18 + 9) = 0x3f800000;
  scored_action::scored_action(local_2c,0xffffffff,0.0);
  v_hashmap<unsigned_char_*,_Search::scored_action>::v_hashmap(in_stack_ffffffffffffff50);
  v_hashmap<unsigned_char_*,_Search::scored_action>::set_default_value
            ((v_hashmap<unsigned_char_*,_Search::scored_action> *)(local_18 + 0x5f),local_2c);
  v_hashmap<unsigned_char_*,_Search::scored_action>::set_equivalent
            ((v_hashmap<unsigned_char_*,_Search::scored_action> *)(local_18 + 0x5f),
             cached_item_equivalent);
  local_10[1] = 0;
  v_init<std::pair<float,unsigned_long>>();
  local_18[0xbc] = local_40;
  local_18[0xbd] = uStack_38;
  local_18[0xba] = local_50;
  local_18[0xbb] = uStack_48;
  v_init<v_array<std::pair<COST_SENSITIVE::wclass&,bool>>>();
  *(undefined4 *)(local_18 + 0xc0) = local_60;
  *(undefined4 *)((long)local_18 + 0x604) = uStack_5c;
  *(undefined4 *)(local_18 + 0xc1) = uStack_58;
  *(undefined4 *)((long)local_18 + 0x60c) = uStack_54;
  *(undefined4 *)(local_18 + 0xbe) = local_70;
  *(undefined4 *)((long)local_18 + 0x5f4) = uStack_6c;
  *(undefined4 *)(local_18 + 0xbf) = uStack_68;
  *(undefined4 *)((long)local_18 + 0x5fc) = uStack_64;
  (*(code *)COST_SENSITIVE::cs_label)(local_18 + 0xc5);
  std::__cxx11::string::string((string *)(local_18 + 0x9f));
  psVar2 = (stringstream *)operator_new(0x188);
  psVar3 = (string *)(local_18 + 0x9f);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(psVar2,psVar3,_Var1);
  local_18[0xa3] = psVar2;
  memset(local_18 + 0x2f,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3b7385);
  std::__cxx11::stringstream::stringstream((stringstream *)(local_18 + 0x6b));
  return;
}

Assistant:

void search_initialize(vw* all, search& sch)
{
  search_private& priv = *sch.priv;  // priv is zero initialized by default
  priv.all = all;

  priv.active_csoaa = false;
  priv.label_is_test = mc_label_is_test;

  priv.num_learners = 1;
  priv.state = INITIALIZE;
  priv.mix_per_roll_policy = -2;

  priv.pred_string = new stringstream();
  priv.truth_string = new stringstream();
  priv.bad_string_stream = new stringstream();
  priv.bad_string_stream->clear(priv.bad_string_stream->badbit);

  priv.rollout_method = MIX_PER_ROLL;
  priv.rollin_method = MIX_PER_ROLL;

  priv.allow_current_policy = true;
  priv.adaptive_beta = true;

  priv.total_number_of_policies = 1;

  priv.acset.max_bias_ngram_length = 1;

  priv.acset.feature_value = 1.;

  scored_action sa((action)-1, 0.);
  new (&priv.cache_hash_map) v_hashmap<unsigned char*, scored_action>();
  priv.cache_hash_map.set_default_value(sa);
  priv.cache_hash_map.set_equivalent(cached_item_equivalent);

  sch.task_data = nullptr;

  priv.active_uncertainty = v_init<pair<float, size_t>>();
  priv.active_known = v_init<v_array<pair<CS::wclass&, bool>>>();

  CS::cs_label.default_label(&priv.empty_cs_label);

  new (&priv.rawOutputString) string();
  priv.rawOutputStringStream = new stringstream(priv.rawOutputString);
  new (&priv.test_action_sequence) vector<action>();
  new (&priv.dat_new_feature_audit_ss) stringstream();
}